

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  uint *puVar4;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  *pVVar5;
  BacktrackData *pBVar6;
  int iVar7;
  BacktrackObject *pBVar8;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> local_48;
  undefined1 local_30 [8];
  Value local_28;
  
  iVar7 = (*n->_vptr_Node[2])(n);
  if ((char)iVar7 == '\0') {
    uVar3 = *(uint *)&n[1]._vptr_Node;
    if ((this->_svStack)._cursor == (this->_svStack)._end) {
      ::Lib::Stack<unsigned_int>::expand(&this->_svStack);
    }
    puVar4 = (this->_svStack)._cursor;
    *puVar4 = uVar3;
    (this->_svStack)._cursor = puVar4 + 1;
    local_48._isSome = false;
    local_48._1_7_ = 0;
    local_48._elem._elem = (Value)0x0;
    ::Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::
    operator=(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
              ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar2 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    Indexing::RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
    ::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Lhs>
              ((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
                *)local_30,(IntermediateNode *)n,(this->_algo)._unif,1);
    if ((this->_nodeIterators)._cursor == (this->_nodeIterators)._end) {
      ::Lib::
      Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>
      ::expand(&this->_nodeIterators);
    }
    pVVar5 = (this->_nodeIterators)._cursor;
    pVVar5->_core =
         (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
          *)local_30;
    if (local_30 != (undefined1  [8])0x0) {
      piVar1 = (int *)&((Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)local_30)->field_0x8;
      *piVar1 = *piVar1 + 1;
    }
    (this->_nodeIterators)._cursor = pVVar5 + 1;
    if (local_30 != (undefined1  [8])0x0) {
      piVar1 = (int *)&((Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)local_30)->field_0x8;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(_func_int **)
           ((long)(((Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)local_30)->_self)._M_t.
                  super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                  .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false> + 8))();
      }
    }
    if (backtrackable) {
      pBVar6 = (this->_bdStack)._cursor;
      pBVar8 = (BacktrackObject *)
               ::Lib::FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
      ;
      pBVar8->_vptr_BacktrackObject = (_func_int **)&PTR__BacktrackObject_00b6d080;
      pBVar8[1]._vptr_BacktrackObject = (_func_int **)this;
      pBVar8->_next = pBVar6[-1]._boList;
      pBVar6[-1]._boList = pBVar8;
    }
  }
  else {
    (*n->_vptr_Node[8])(&local_28,n);
    local_48._isSome = true;
    if (local_28 == (Value)0x0) {
      local_48._elem._elem = local_28;
    }
    else {
      iVar7 = *(int *)((long)local_28 + 8);
      *(int *)((long)local_28 + 8) = iVar7 + 1;
      local_48._elem._elem = local_28;
      *(int *)((long)local_28 + 8) = iVar7 + 2;
      plVar2 = (long *)((long)local_28 + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
    ::Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::
    operator=(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
              ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar2 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    if (local_28 != (Value)0x0) {
      plVar2 = (long *)((long)local_28 + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }